

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_artist.cpp
# Opt level: O2

void __thiscall polyscope::VectorArtist::createProgram(VectorArtist *this)

{
  element_type *peVar1;
  Engine *pEVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_cb;
  allocator local_ca;
  allocator local_c9;
  string local_c8 [32];
  __shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80 [32];
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pEVar2 = render::engine;
  std::__cxx11::string::string(local_c8,"RAYCAST_VECTOR",&local_c9);
  std::__cxx11::string::string((string *)&local_40,"SHADE_BASECOLOR",&local_ca);
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l,&local_cb);
  (*pEVar2->_vptr_Engine[0x23])(&local_a8,pEVar2,local_c8,&local_98,0);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->program).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             &local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string(local_c8);
  peVar1 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_60,"a_vector",(allocator *)local_c8);
  (*peVar1->_vptr_ShaderProgram[0x10])(peVar1,local_60,this->vectors,0,0,0xffffffffffffffff);
  std::__cxx11::string::~string(local_60);
  peVar1 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_80,"a_position",(allocator *)local_c8);
  (*peVar1->_vptr_ShaderProgram[0x10])(peVar1,local_80,this->bases,0,0,0xffffffffffffffff);
  std::__cxx11::string::~string(local_80);
  render::Engine::setMaterial
            (render::engine,
             (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,&(this->material).value);
  return;
}

Assistant:

void VectorArtist::createProgram() {
  program = render::engine->requestShader("RAYCAST_VECTOR", {"SHADE_BASECOLOR"});

  // Fill buffers
  program->setAttribute("a_vector", vectors);
  program->setAttribute("a_position", bases);

  render::engine->setMaterial(*program, material.get());
}